

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O0

void SelectiveBranchingMT::run(search *sch,multi_ex *ec)

{
  pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *ppVar1;
  stringstream *psVar2;
  ulong uVar3;
  _func_void_search_ptr_size_t_float_action_bool_float *p_Var4;
  BaseTask *pBVar5;
  _func_void_search_ptr_size_t_action_float *p_Var6;
  _func_void_search_ptr_stringstream_ptr *p_Var7;
  pair<float,_v_array<std::pair<unsigned_int,_float>_>_> **pppVar8;
  size_t sVar9;
  size_t sVar10;
  _func_bool_search_ptr_size_t_action_ptr_float_ptr *p_Var11;
  pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  **pppVar12;
  stringstream *this;
  pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar13;
  ostream *poVar14;
  void *this_00;
  search *in_RDI;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  path this_final;
  size_t i;
  path original_final;
  task_data *d;
  pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *in_stack_fffffffffffffd48;
  search *in_stack_fffffffffffffd50;
  v_array<std::pair<unsigned_int,_float>_> *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  v_array<std::pair<unsigned_int,_float>_> *in_stack_fffffffffffffd60;
  BaseTask *in_stack_fffffffffffffdb0;
  size_t local_208;
  ulong local_200;
  __11 local_1f3;
  __10 local_1f2;
  __9 local_1f1;
  BaseTask local_1f0;
  ulong local_1b8;
  __7 local_11c;
  __6 local_11b;
  __5 local_11a;
  __4 local_119;
  BaseTask local_118;
  ulong local_e0;
  __2 local_53;
  __1 local_52;
  __0 local_51;
  BaseTask local_50;
  task_data *local_18;
  
  local_18 = Search::search::get_metatask_data<SelectiveBranchingMT::task_data>(in_RDI);
  v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::clear
            ((v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_> *)
             in_stack_fffffffffffffd50);
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::clear((v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
           *)in_stack_fffffffffffffd50);
  v_array<std::pair<unsigned_int,_float>_>::clear
            ((v_array<std::pair<unsigned_int,_float>_> *)in_stack_fffffffffffffd50);
  local_18->total_cost = 0.0;
  local_18->output_string = (string *)0x0;
  Search::search::base_task(in_stack_fffffffffffffd50,(multi_ex *)in_stack_fffffffffffffd48);
  p_Var4 = run(Search::search&,std::vector&)::$_0::operator_cast_to_function_pointer(&local_51);
  pBVar5 = Search::BaseTask::foreach_action(&local_50,p_Var4);
  p_Var6 = run(Search::search&,std::vector&)::$_1::operator_cast_to_function_pointer(&local_52);
  pBVar5 = Search::BaseTask::post_prediction(pBVar5,p_Var6);
  p_Var7 = run(Search::search&,std::vector&)::$_2::operator_cast_to_function_pointer(&local_53);
  Search::BaseTask::with_output_string(pBVar5,p_Var7);
  Search::BaseTask::Run(in_stack_fffffffffffffdb0);
  v_init<std::pair<unsigned_int,float>>();
  copy_array<std::pair<unsigned_int,float>>(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::make_pair<float&,v_array<std::pair<unsigned_int,float>>&>
            ((float *)in_stack_fffffffffffffd50,
             (v_array<std::pair<unsigned_int,_float>_> *)in_stack_fffffffffffffd48);
  std::make_pair<std::pair<float,v_array<std::pair<unsigned_int,float>>>,std::__cxx11::string*&>
            ((pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *)in_stack_fffffffffffffd50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             in_stack_fffffffffffffd48);
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::push_back((v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  pppVar8 = v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::begin
                      (&local_18->branches);
  ppVar1 = *pppVar8;
  pppVar8 = v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::end
                      (&local_18->branches);
  std::
  stable_sort<std::pair<float,v_array<std::pair<unsigned_int,float>>>*,SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::__3>
            (ppVar1,*pppVar8);
  local_e0 = 0;
  while( true ) {
    uVar3 = local_e0;
    sVar10 = local_18->max_branches;
    sVar9 = v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::size
                      (&local_18->branches);
    sVar10 = min(sVar10,sVar9);
    if (sVar10 <= uVar3) break;
    local_18->cur_branch = local_e0;
    v_array<std::pair<unsigned_int,_float>_>::clear
              ((v_array<std::pair<unsigned_int,_float>_> *)in_stack_fffffffffffffd50);
    local_18->total_cost = 0.0;
    local_18->output_string = (string *)0x0;
    Search::search::base_task(in_stack_fffffffffffffd50,(multi_ex *)in_stack_fffffffffffffd48);
    p_Var4 = run(Search::search&,std::vector&)::$_4::operator_cast_to_function_pointer(&local_119);
    pBVar5 = Search::BaseTask::foreach_action(&local_118,p_Var4);
    p_Var11 = run(Search::search&,std::vector&)::$_5::operator_cast_to_function_pointer(&local_11a);
    in_stack_fffffffffffffdb0 = Search::BaseTask::maybe_override_prediction(pBVar5,p_Var11);
    p_Var6 = run(Search::search&,std::vector&)::$_6::operator_cast_to_function_pointer(&local_11b);
    pBVar5 = Search::BaseTask::post_prediction(in_stack_fffffffffffffdb0,p_Var6);
    p_Var7 = run(Search::search&,std::vector&)::$_7::operator_cast_to_function_pointer(&local_11c);
    Search::BaseTask::with_output_string(pBVar5,p_Var7);
    Search::BaseTask::Run(in_stack_fffffffffffffdb0);
    v_init<std::pair<unsigned_int,float>>();
    copy_array<std::pair<unsigned_int,float>>(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    std::make_pair<float&,v_array<std::pair<unsigned_int,float>>&>
              ((float *)in_stack_fffffffffffffd50,
               (v_array<std::pair<unsigned_int,_float>_> *)in_stack_fffffffffffffd48);
    std::make_pair<std::pair<float,v_array<std::pair<unsigned_int,float>>>,std::__cxx11::string*&>
              ((pair<float,_v_array<std::pair<unsigned_int,_float>_>_> *)in_stack_fffffffffffffd50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               in_stack_fffffffffffffd48);
    v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::push_back((v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    local_e0 = local_e0 + 1;
  }
  pppVar12 = v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             ::begin(&local_18->final);
  ppVar13 = *pppVar12;
  pppVar12 = v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             ::end(&local_18->final);
  std::
  stable_sort<std::pair<std::pair<float,v_array<std::pair<unsigned_int,float>>>,std::__cxx11::string*>*,SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::__8>
            (ppVar13,*pppVar12);
  local_18->kbest_out = (stringstream *)0x0;
  if ((local_18->output_string != (string *)0x0) && (local_18->kbest != 0)) {
    this = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this);
    local_18->kbest_out = (stringstream *)this;
    local_1b8 = 0;
    while( true ) {
      uVar3 = local_1b8;
      sVar10 = v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               ::size(&local_18->final);
      sVar10 = min(sVar10,local_18->kbest);
      if (sVar10 <= uVar3) break;
      psVar2 = local_18->kbest_out;
      ppVar13 = v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                ::operator[](&local_18->final,local_1b8);
      poVar14 = std::operator<<((ostream *)(psVar2 + 0x10),(string *)ppVar13->second);
      poVar14 = std::operator<<(poVar14,"\t");
      ppVar13 = v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                ::operator[](&local_18->final,local_1b8);
      this_00 = (void *)std::ostream::operator<<(poVar14,(ppVar13->first).first);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_1b8 = local_1b8 + 1;
    }
  }
  local_18->cur_branch = 0;
  local_18->output_string = (string *)0x0;
  Search::search::base_task(in_stack_fffffffffffffd50,(multi_ex *)in_stack_fffffffffffffd48);
  p_Var4 = run(Search::search&,std::vector&)::$_9::operator_cast_to_function_pointer(&local_1f1);
  pBVar5 = Search::BaseTask::foreach_action(&local_1f0,p_Var4);
  p_Var11 = run(Search::search&,std::vector&)::$_10::operator_cast_to_function_pointer(&local_1f2);
  pBVar5 = Search::BaseTask::maybe_override_prediction(pBVar5,p_Var11);
  p_Var7 = run(Search::search&,std::vector&)::$_11::operator_cast_to_function_pointer(&local_1f3);
  pBVar5 = Search::BaseTask::with_output_string(pBVar5,p_Var7);
  Search::BaseTask::final_run(pBVar5);
  Search::BaseTask::Run(in_stack_fffffffffffffdb0);
  for (local_200 = 0;
      sVar10 = v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::size
                         (&local_18->branches), local_200 < sVar10; local_200 = local_200 + 1) {
    v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::operator[]
              (&local_18->branches,local_200);
    v_array<std::pair<unsigned_int,_float>_>::delete_v
              ((v_array<std::pair<unsigned_int,_float>_> *)in_stack_fffffffffffffd50);
  }
  v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::clear
            ((v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_> *)
             in_stack_fffffffffffffd50);
  local_208 = 0;
  while (sVar10 = local_208,
        sVar9 = v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                ::size(&local_18->final), sVar10 < sVar9) {
    v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::operator[](&local_18->final,local_208);
    v_array<std::pair<unsigned_int,_float>_>::delete_v
              ((v_array<std::pair<unsigned_int,_float>_> *)in_stack_fffffffffffffd50);
    ppVar13 = v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              ::operator[](&local_18->final,local_208);
    this_01 = ppVar13->second;
    if (this_01 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::__cxx11::string::~string((string *)this_01);
      operator_delete(this_01);
    }
    local_208 = local_208 + 1;
  }
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::clear((v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
           *)in_stack_fffffffffffffd50);
  if ((local_18->kbest_out != (stringstream *)0x0) && (local_18->kbest_out != (stringstream *)0x0))
  {
    (**(code **)(*(long *)local_18->kbest_out + 8))();
  }
  local_18->kbest_out = (stringstream *)0x0;
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& d = *sch.get_metatask_data<task_data>();

  // generate an initial trajectory, but record possible branches
  d.branches.clear();
  d.final.clear();
  d.trajectory.clear();
  d.total_cost = 0.;
  d.output_string = nullptr;

  cdbg << "*** INITIAL PASS ***" << endl;
  sch.base_task(ec)
      .foreach_action([](Search::search& sch, size_t t, float min_cost, action a, bool taken, float a_cost) -> void {
        cdbg << "==DebugMT== foreach_action(t=" << t << ", min_cost=" << min_cost << ", a=" << a << ", taken=" << taken
             << ", a_cost=" << a_cost << ")" << endl;
        if (taken)
          return;  // ignore the taken action
        task_data& d = *sch.get_metatask_data<task_data>();
        float delta = a_cost - min_cost;
        path branch = v_init<act_score>();
        push_many<act_score>(branch, d.trajectory.begin(), d.trajectory.size());
        branch.push_back(make_pair(a, a_cost));
        d.branches.push_back(make_pair(delta, branch));
        cdbg << "adding branch: " << delta << " -> " << branch << endl;
      })
      .post_prediction([](Search::search& sch, size_t /*t*/, action a, float a_cost) -> void {
        task_data& d = *sch.get_metatask_data<task_data>();
        d.trajectory.push_back(make_pair(a, a_cost));
        d.total_cost += a_cost;
      })
      .with_output_string([](Search::search& sch, stringstream& output) -> void {
        sch.get_metatask_data<task_data>()->output_string = new string(output.str());
      })
      .Run();

  // the last item the trajectory stack is complete and therefore not a branch
  // if (! d.branches.empty())
  //  d.branches.pop().second.delete_v();

  {
    // construct the final trajectory
    path original_final = v_init<act_score>();
    copy_array(original_final, d.trajectory);
    d.final.push_back(make_pair(make_pair(d.total_cost, original_final), d.output_string));
  }

  // sort the branches by cost
  stable_sort(
      d.branches.begin(), d.branches.end(), [](const branch& a, const branch& b) -> bool { return a.first < b.first; });

  // make new predictions
  for (size_t i = 0; i < min(d.max_branches, d.branches.size()); i++)
  {
    d.cur_branch = i;
    d.trajectory.clear();
    d.total_cost = 0.;
    d.output_string = nullptr;

    cdbg << "*** BRANCH " << i << " *** " << d.branches[i].first << " : " << d.branches[i].second << endl;
    sch.base_task(ec)
        .foreach_action([](Search::search& /*sch*/, size_t /*t*/, float /*min_cost*/, action /*a*/, bool /*taken*/,
                            float /*a_cost*/) -> void {})
        .maybe_override_prediction([](Search::search& sch, size_t t, action& a, float& a_cost) -> bool {
          task_data& d = *sch.get_metatask_data<task_data>();
          path& path = d.branches[d.cur_branch].second;
          if (t >= path.size())
            return false;
          a = path[t].first;
          a_cost = path[t].second;
          return true;
        })
        .post_prediction([](Search::search& sch, size_t /*t*/, action a, float a_cost) -> void {
          task_data& d = *sch.get_metatask_data<task_data>();
          d.trajectory.push_back(make_pair(a, a_cost));
          d.total_cost += a_cost;
        })
        .with_output_string([](Search::search& sch, stringstream& output) -> void {
          sch.get_metatask_data<task_data>()->output_string = new string(output.str());
        })
        .Run();

    {
      // construct the final trajectory
      path this_final = v_init<act_score>();
      copy_array(this_final, d.trajectory);
      d.final.push_back(make_pair(make_pair(d.total_cost, this_final), d.output_string));
    }
  }

  // sort the finals by cost
  stable_sort(
      d.final.begin(), d.final.end(), [](const pair<branch, string*>& a, const pair<branch, string*>& b) -> bool {
        return a.first.first < b.first.first;
      });

  d.kbest_out = nullptr;
  if (d.output_string && (d.kbest > 0))
  {
    d.kbest_out = new stringstream();
    for (size_t i = 0; i < min(d.final.size(), d.kbest); i++)
      (*d.kbest_out) << *d.final[i].second << "\t" << d.final[i].first.first << endl;
  }

  // run the final selected trajectory
  cdbg << "*** FINAL ***" << endl;
  d.cur_branch = 0;
  d.output_string = nullptr;
  sch.base_task(ec)
      .foreach_action([](Search::search& /*sch*/, size_t /*t*/, float /*min_cost*/, action /*a*/, bool /*taken*/,
                          float /*a_cost*/) -> void {})
      .maybe_override_prediction([](Search::search& sch, size_t t, action& a, float& a_cost) -> bool {
        task_data& d = *sch.get_metatask_data<task_data>();
        path& path = d.final[d.cur_branch].first.second;
        if ((t >= path.size()) || (path[t].first == (action)-1))
          return false;
        a = path[t].first;
        a_cost = path[t].second;
        return true;
      })
      .with_output_string([](Search::search& sch, stringstream& output) -> void {
        task_data& d = *sch.get_metatask_data<task_data>();
        if (d.kbest_out)
        {
          output.str("");
          output << d.kbest_out->str();
        }
      })
      .final_run()
      .Run();

  // clean up memory
  for (size_t i = 0; i < d.branches.size(); i++) d.branches[i].second.delete_v();
  d.branches.clear();
  for (size_t i = 0; i < d.final.size(); i++)
  {
    d.final[i].first.second.delete_v();
    delete d.final[i].second;
  }
  d.final.clear();
  if (d.kbest_out)
    delete d.kbest_out;
  d.kbest_out = nullptr;
}